

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGhsMultiTargetGenerator.cxx
# Opt level: O1

void __thiscall cmGhsMultiTargetGenerator::Generate(cmGhsMultiTargetGenerator *this)

{
  bool bVar1;
  TargetType TVar2;
  int iVar3;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  string msg;
  string local_130;
  undefined1 local_110 [256];
  
  TVar2 = cmGeneratorTarget::GetType(this->GeneratorTarget);
  switch(TVar2) {
  case EXECUTABLE:
    cmGeneratorTarget::GetExecutableNames
              ((Names *)local_110,this->GeneratorTarget,&this->ConfigName);
    std::__cxx11::string::operator=((string *)&this->TargetNameReal,(string *)(local_110 + 0x40));
    cmGeneratorTarget::Names::~Names((Names *)local_110);
    bVar1 = DetermineIfIntegrityApp(this);
    if (bVar1) {
      this->TagType = INTERGRITY_APPLICATION;
    }
    else {
      this->TagType = PROGRAM;
    }
    break;
  case STATIC_LIBRARY:
    cmGeneratorTarget::GetLibraryNames((Names *)local_110,this->GeneratorTarget,&this->ConfigName);
    std::__cxx11::string::operator=((string *)&this->TargetNameReal,(string *)(local_110 + 0x40));
    cmGeneratorTarget::Names::~Names((Names *)local_110);
    this->TagType = LIBRARY;
    break;
  case SHARED_LIBRARY:
    local_110._0_8_ = (pointer)0x2e;
    local_110._8_8_ = "add_library(<name> SHARED ...) not supported: ";
    local_110._16_8_ = 0;
    local_110._32_8_ = (this->Name)._M_dataplus._M_p;
    local_110._24_8_ = (this->Name)._M_string_length;
    local_110._40_8_ = 0;
    views._M_len = 2;
    views._M_array = (iterator)local_110;
    cmCatViews(&local_130,views);
    cmSystemTools::Message(&local_130,(char *)0x0);
    goto LAB_003be0af;
  case MODULE_LIBRARY:
    local_110._0_8_ = (pointer)0x2e;
    local_110._8_8_ = "add_library(<name> MODULE ...) not supported: ";
    local_110._16_8_ = 0;
    local_110._32_8_ = (this->Name)._M_dataplus._M_p;
    local_110._24_8_ = (this->Name)._M_string_length;
    local_110._40_8_ = 0;
    views_00._M_len = 2;
    views_00._M_array = (iterator)local_110;
    cmCatViews(&local_130,views_00);
    cmSystemTools::Message(&local_130,(char *)0x0);
LAB_003be0af:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p == &local_130.field_2) {
      return;
    }
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    return;
  case OBJECT_LIBRARY:
    cmGeneratorTarget::GetLibraryNames((Names *)local_110,this->GeneratorTarget,&this->ConfigName);
    std::__cxx11::string::operator=((string *)&this->TargetNameReal,(string *)(local_110 + 0x40));
    cmGeneratorTarget::Names::~Names((Names *)local_110);
    this->TagType = SUBPROJECT;
    break;
  case UTILITY:
    cmGeneratorTarget::GetName_abi_cxx11_(this->GeneratorTarget);
    std::__cxx11::string::_M_assign((string *)&this->TargetNameReal);
    goto LAB_003be168;
  case GLOBAL_TARGET:
    cmGeneratorTarget::GetName_abi_cxx11_(this->GeneratorTarget);
    std::__cxx11::string::_M_assign((string *)&this->TargetNameReal);
    (*((this->LocalGenerator->super_cmLocalGenerator).GlobalGenerator)->_vptr_cmGlobalGenerator
      [0x1c])();
    iVar3 = std::__cxx11::string::compare((char *)&this->TargetNameReal);
    if (iVar3 != 0) {
      return;
    }
LAB_003be168:
    this->TagType = CUSTOM_TARGET;
    break;
  default:
    goto switchD_003bdf75_default;
  }
  GenerateTarget(this);
switchD_003bdf75_default:
  return;
}

Assistant:

void cmGhsMultiTargetGenerator::Generate()
{
  // Determine type of target for this project
  switch (this->GeneratorTarget->GetType()) {
    case cmStateEnums::EXECUTABLE: {
      // Get the name of the executable to generate.
      this->TargetNameReal =
        this->GeneratorTarget->GetExecutableNames(this->ConfigName).Real;
      if (this->cmGhsMultiTargetGenerator::DetermineIfIntegrityApp()) {
        this->TagType = GhsMultiGpj::INTERGRITY_APPLICATION;
      } else {
        this->TagType = GhsMultiGpj::PROGRAM;
      }
      break;
    }
    case cmStateEnums::STATIC_LIBRARY: {
      this->TargetNameReal =
        this->GeneratorTarget->GetLibraryNames(this->ConfigName).Real;
      this->TagType = GhsMultiGpj::LIBRARY;
      break;
    }
    case cmStateEnums::SHARED_LIBRARY: {
      std::string msg =
        cmStrCat("add_library(<name> SHARED ...) not supported: ", this->Name);
      cmSystemTools::Message(msg);
      return;
    }
    case cmStateEnums::OBJECT_LIBRARY: {
      this->TargetNameReal =
        this->GeneratorTarget->GetLibraryNames(this->ConfigName).Real;
      this->TagType = GhsMultiGpj::SUBPROJECT;
      break;
    }
    case cmStateEnums::MODULE_LIBRARY: {
      std::string msg =
        cmStrCat("add_library(<name> MODULE ...) not supported: ", this->Name);
      cmSystemTools::Message(msg);
      return;
    }
    case cmStateEnums::UTILITY: {
      this->TargetNameReal = this->GeneratorTarget->GetName();
      this->TagType = GhsMultiGpj::CUSTOM_TARGET;
      break;
    }
    case cmStateEnums::GLOBAL_TARGET: {
      this->TargetNameReal = this->GeneratorTarget->GetName();
      if (this->TargetNameReal ==
          this->GetGlobalGenerator()->GetInstallTargetName()) {
        this->TagType = GhsMultiGpj::CUSTOM_TARGET;
      } else {
        return;
      }
      break;
    }
    default:
      return;
  }

  this->GenerateTarget();
}